

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<int,unsigned_long,std::__cxx11::string,int,int>
                   (char *fmt,int *args,unsigned_long *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   int *args_3,int *args_4)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  ostringstream *this;
  int *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  ostringstream local_180 [112];
  int *in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  args_2_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  format<int,unsigned_long,std::__cxx11::string,int,int>
            (in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(unsigned_long *)this,
             args_2_00,(int *)in_RDI,in_stack_fffffffffffffef0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_2_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}